

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPReportController.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_40741d::OpenMPReportController::OpenMPReportController
          (OpenMPReportController *this,bool use_mpi,char *name,config_map_t *initial_cfg,
          Options *opts)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  config_map_t *pcVar4;
  mapped_type *pmVar5;
  info_map_t *metadata;
  allocator<char> local_271;
  key_type local_270;
  string local_250;
  allocator<char> local_229;
  key_type local_228;
  string local_208;
  allocator<char> local_1e1;
  key_type local_1e0;
  allocator<char> local_1b9;
  key_type local_1b8;
  string local_198;
  allocator<char> local_171;
  key_type local_170;
  string local_150;
  allocator<char> local_129;
  key_type local_128;
  allocator<char> local_101;
  key_type local_100;
  string local_e0;
  allocator<char> local_b9;
  key_type local_b8;
  char *local_98;
  char *format;
  undefined1 local_88 [8];
  string cross_query;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string local_query;
  Options *opts_local;
  config_map_t *initial_cfg_local;
  char *name_local;
  bool use_mpi_local;
  OpenMPReportController *this_local;
  
  local_query.field_2._8_8_ = opts;
  cali::ChannelController::ChannelController(&this->super_ChannelController,name,0,initial_cfg);
  (this->super_ChannelController)._vptr_ChannelController = (_func_int **)&PTR_on_create_00550108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,
             "let sum#time.duration=scale(sum#time.duration.ns,1e-9),n.threads=first(omp.num.threads),t.initial=first(sum#time.duration) if omp.thread.type=initial select max(n.threads) as \"#Threads\",inclusive_sum(t.initial) as \"Time (thread)\",inclusive_sum(sum#time.duration) as \"Time (total)\""
             ,&local_51);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,
             " max(max#n.threads) as \"#Threads\",avg(inclusive#t.initial) as \"Time (thread) (avg)\",sum(inclusive#sum#time.duration) as \"Time (total)\""
             ,(allocator<char> *)((long)&format + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&format + 7));
  bVar2 = cali::ConfigManager::Options::is_enabled
                    ((Options *)local_query.field_2._8_8_,"show_regions");
  local_98 = "table";
  if (bVar2) {
    local_98 = "tree";
  }
  pcVar3 = (char *)std::__cxx11::string::append(local_50);
  std::__cxx11::string::append(pcVar3);
  pcVar3 = (char *)std::__cxx11::string::append(local_88);
  std::__cxx11::string::append(pcVar3);
  if (use_mpi) {
    pcVar4 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"CALI_SERVICES_ENABLE",&local_b9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_b8);
    std::__cxx11::string::append((char *)pmVar5);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    cali::ConfigManager::Options::get_abi_cxx11_
              (&local_e0,(Options *)local_query.field_2._8_8_,"output","stderr");
    pcVar4 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"CALI_MPIREPORT_FILENAME",&local_101);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_100);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    std::__cxx11::string::~string((string *)&local_e0);
    pcVar4 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"CALI_MPIREPORT_WRITE_ON_FINALIZE",&local_129);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_128);
    std::__cxx11::string::operator=((string *)pmVar5,"false");
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    cali::ConfigManager::Options::build_query
              (&local_150,(Options *)local_query.field_2._8_8_,"local",(string *)local_50);
    pcVar4 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"CALI_MPIREPORT_LOCAL_CONFIG",&local_171);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_170);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    std::__cxx11::string::~string((string *)&local_150);
    cali::ConfigManager::Options::build_query
              (&local_198,(Options *)local_query.field_2._8_8_,"cross",(string *)local_88);
    pcVar4 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"CALI_MPIREPORT_CONFIG",&local_1b9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_1b8);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
    std::__cxx11::string::~string((string *)&local_198);
  }
  else {
    pcVar4 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"CALI_SERVICES_ENABLE",&local_1e1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_1e0);
    std::__cxx11::string::append((char *)pmVar5);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    cali::ConfigManager::Options::get_abi_cxx11_
              (&local_208,(Options *)local_query.field_2._8_8_,"output","stderr");
    pcVar4 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"CALI_REPORT_FILENAME",&local_229);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_228);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
    std::__cxx11::string::~string((string *)&local_208);
    cali::ConfigManager::Options::build_query
              (&local_250,(Options *)local_query.field_2._8_8_,"local",(string *)local_50);
    pcVar4 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"CALI_REPORT_CONFIG",&local_271);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_270);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    std::__cxx11::string::~string((string *)&local_250);
  }
  uVar1 = local_query.field_2._8_8_;
  pcVar4 = cali::ChannelController::config_abi_cxx11_(&this->super_ChannelController);
  cali::ConfigManager::Options::update_channel_config((Options *)uVar1,pcVar4);
  uVar1 = local_query.field_2._8_8_;
  metadata = cali::ChannelController::metadata_abi_cxx11_(&this->super_ChannelController);
  cali::ConfigManager::Options::update_channel_metadata((Options *)uVar1,metadata);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

OpenMPReportController(
        bool                          use_mpi,
        const char*                   name,
        const config_map_t&           initial_cfg,
        const ConfigManager::Options& opts
    )
        : ChannelController(name, 0, initial_cfg)
    {
        // Config for serial-mode aggregation
        std::string local_query =
            "let sum#time.duration=scale(sum#time.duration.ns,1e-9)"
            ",n.threads=first(omp.num.threads)"
            ",t.initial=first(sum#time.duration) if omp.thread.type=initial"
            " select max(n.threads) as \"#Threads\""
            ",inclusive_sum(t.initial) as \"Time (thread)\""
            ",inclusive_sum(sum#time.duration) as \"Time (total)\"";

        // Config for second aggregation step in MPI mode (cross-process aggregation)
        std::string cross_query =
            " max(max#n.threads) as \"#Threads\""
            ",avg(inclusive#t.initial) as \"Time (thread) (avg)\""
            ",sum(inclusive#sum#time.duration) as \"Time (total)\"";

        const char* format = opts.is_enabled("show_regions") ? "tree" : "table";

        local_query.append(" format ").append(format);
        cross_query.append(" format ").append(format);

        if (use_mpi) {
            config()["CALI_SERVICES_ENABLE"].append(",mpi,mpireport");
            config()["CALI_MPIREPORT_FILENAME"]          = opts.get("output", "stderr");
            config()["CALI_MPIREPORT_WRITE_ON_FINALIZE"] = "false";
            config()["CALI_MPIREPORT_LOCAL_CONFIG"]      = opts.build_query("local", local_query);
            config()["CALI_MPIREPORT_CONFIG"]            = opts.build_query("cross", cross_query);
        } else {
            config()["CALI_SERVICES_ENABLE"].append(",report");
            config()["CALI_REPORT_FILENAME"] = opts.get("output", "stderr");
            config()["CALI_REPORT_CONFIG"]   = opts.build_query("local", local_query);
        }

        opts.update_channel_config(config());
        opts.update_channel_metadata(metadata());
    }